

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  TValue *obj;
  byte bVar1;
  ulong uVar2;
  
  obj = index2value(L,idx);
  bVar1 = obj->tt_ & 0xf;
  if (bVar1 == 3) {
    luaO_tostring(L,obj);
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    obj = index2value(L,idx);
  }
  else if (bVar1 != 4) {
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    return (char *)0x0;
  }
  if (len != (size_t *)0x0) {
    uVar2 = (ulong)(byte)(obj->value_).f[0xb];
    if (uVar2 == 0xff) {
      uVar2 = *(ulong *)((obj->value_).f + 0x10);
    }
    *len = uVar2;
  }
  return (char *)((obj->value_).f + 0x18);
}

Assistant:

LUA_API const char *lua_tolstring (lua_State *L, int idx, size_t *len) {
  TValue *o;
  lua_lock(L);
  o = index2value(L, idx);
  if (!ttisstring(o)) {
    if (!cvt2str(o)) {  /* not convertible? */
      if (len != NULL) *len = 0;
      lua_unlock(L);
      return NULL;
    }
    luaO_tostring(L, o);
    luaC_checkGC(L);
    o = index2value(L, idx);  /* previous call may reallocate the stack */
  }
  if (len != NULL)
    *len = tsslen(tsvalue(o));
  lua_unlock(L);
  return getstr(tsvalue(o));
}